

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int rtc_set_references_external_ref_frame_config(AV1_COMP *cpi)

{
  int i;
  int ref;
  AV1_COMP *cpi_local;
  
  ref = 0x7f;
  for (i = 0; i < 7; i = i + 1) {
    if ((cpi->ppi->rtc_ref).reference[i] == 0) {
      ref = 1 << ((byte)i & 0x1f) ^ ref;
    }
  }
  return ref;
}

Assistant:

static int rtc_set_references_external_ref_frame_config(AV1_COMP *cpi) {
  // LAST_FRAME (0), LAST2_FRAME(1), LAST3_FRAME(2), GOLDEN_FRAME(3),
  // BWDREF_FRAME(4), ALTREF2_FRAME(5), ALTREF_FRAME(6).
  int ref = AOM_REFFRAME_ALL;
  for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    if (!cpi->ppi->rtc_ref.reference[i]) ref ^= (1 << i);
  }
  return ref;
}